

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O1

Literal * Kernel::LiteralNormalizer::normalize(Literal *in)

{
  uint pred;
  bool bVar1;
  Interpretation IVar2;
  Literal *pLVar3;
  
  pred = (in->super_Term)._functor;
  bVar1 = Theory::isInterpretedPredicate((Theory *)theory,pred);
  if (bVar1) {
    IVar2 = Theory::interpretPredicate((Theory *)theory,pred);
    if (IVar2 == REAL_LESS) {
      pLVar3 = InequalityNormalizer<Kernel::FracLess<Kernel::RealConstantType>_>::normalize(in);
      return pLVar3;
    }
    if (IVar2 == RAT_LESS) {
      pLVar3 = InequalityNormalizer<Kernel::FracLess<Kernel::RationalConstantType>_>::normalize(in);
      return pLVar3;
    }
    if (IVar2 == INT_LESS) {
      pLVar3 = InequalityNormalizer<Kernel::IntLess>::normalize(in);
      return pLVar3;
    }
  }
  return in;
}

Assistant:

static Literal* normalize(Literal* in) {
    auto functor = in->functor();

    if (theory->isInterpretedPredicate(functor)) {
      auto i = theory->interpretPredicate(functor);

      switch (i) {
        case Interpretation::INT_LESS: 
          return InequalityNormalizer<IntLess>::normalize(in);

        case Interpretation::RAT_LESS: 
          return InequalityNormalizer<FracLess<RationalConstantType>>::normalize(in);

        case Interpretation::REAL_LESS: 
          return InequalityNormalizer<FracLess<RealConstantType>>::normalize(in);

        default: 
          return in;
      }
    } else {
      /* uninterpreted predicate */
      return in;
    }
  }